

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O2

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersGL<Diligent::ComputePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,ComputePipelineStateCreateInfo *CreateInfo)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  undefined4 extraout_var;
  char (*in_RCX) [60];
  long lVar4;
  long lVar5;
  IShader *pIVar6;
  SerializedShaderImpl **ppSVar7;
  bool bVar8;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> pShaderImpl;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  local_e8;
  string msg;
  
  local_e8.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[39]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsComputePipeline()",(char (*) [39])in_RCX);
    in_RCX = (char (*) [60])0x101;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x101);
    std::__cxx11::string::~string((string *)&msg);
    local_e8.
    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
      FormatString<char[26],char[57]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE",
                 (char (*) [57])in_RCX);
      in_RCX = (char (*) [60])0x105;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ExtractShaders",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x105);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  pIVar6 = CreateInfo->pCS;
  if (pIVar6 == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS != nullptr",(char (*) [26])in_RCX);
    in_RCX = (char (*) [60])0x106;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x106);
    std::__cxx11::string::~string((string *)&msg);
    pIVar6 = CreateInfo->pCS;
  }
  iVar3 = (*(pIVar6->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar3) + 8) != 0x20) {
    FormatString<char[26],char[60]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE",in_RCX);
    in_RCX = (char (*) [60])0x107;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x107);
    std::__cxx11::string::~string((string *)&msg);
  }
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::RefCntAutoPtr
            (&pShaderImpl,(IObject *)CreateInfo->pCS,
             (INTERFACE_ID *)SerializedShaderImpl::IID_InternalImpl);
  if (pShaderImpl.m_pObject == (SerializedShaderImpl *)0x0) {
    FormatString<char[40]>(&msg,(char (*) [40])"Unexpected shader object implementation");
    in_RCX = (char (*) [60])0x10a;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10a);
    std::__cxx11::string::~string((string *)&msg);
  }
  PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::SerializedShaderImpl>
            (&pShaderImpl,true);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>>
  ::emplace_back<Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>&>
            ((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>>
              *)&local_e8,&pShaderImpl);
  pSVar2 = local_e8.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar1 = local_e8.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_e8.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_e8.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!ShaderStages.empty()",
               (char (*) [22])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10f);
    std::__cxx11::string::~string((string *)&msg);
  }
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::Release(&pShaderImpl);
  if ((this->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty()",
               (char (*) [64])this);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x222);
    std::__cxx11::string::~string((string *)&msg);
  }
  lVar4 = (long)pSVar2 - (long)pSVar1 >> 4;
  ppSVar7 = &pSVar1->pShader;
  lVar5 = lVar4;
  while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
    msg._M_string_length =
         (size_type)((*ppSVar7)->m_CreateInfo).m_CreateInfo.pShaderSourceStreamFactory;
    msg.field_2._M_allocated_capacity =
         (size_type)
         ((*ppSVar7)->m_Shaders)._M_elems[0]._M_t.
         super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
         ._M_t.
         super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
         .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>.
         _M_head_impl[0x1e]._vptr_CompiledShader;
    msg._M_dataplus._M_p = (pointer)0x0;
    msg.field_2._8_8_ = 0;
    SerializeShaderCreateInfo(this,OpenGL,(ShaderCreateInfo *)&msg);
    ppSVar7 = ppSVar7 + 2;
  }
  if (((long)(this->m_Data).Shaders._M_elems[0].
             super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->m_Data).Shaders._M_elems[0].
            super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x30 != lVar4) {
    FormatString<char[26],char[86]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size()"
               ,(char (*) [86])0x30);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x22c);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersGL(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoGL> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty());
    for (size_t i = 0; i < ShaderStages.size(); ++i)
    {
        const auto& Stage             = ShaderStages[i];
        const auto& CI                = Stage.pShader->GetCreateInfo();
        const auto* pCompiledShaderGL = Stage.pShader->GetShader<CompiledShaderGL>(DeviceObjectArchive::DeviceType::OpenGL);
        const auto  SerCI             = pCompiledShaderGL->GetSerializationCI(CI);

        SerializeShaderCreateInfo(DeviceType::OpenGL, SerCI);
    }
    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size());
}